

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O2

SerializedData * __thiscall
Diligent::DeviceObjectArchive::GetDeviceSpecificData
          (DeviceObjectArchive *this,ResourceType Type,char *Name,DeviceType DevType)

{
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  char (*Args_1) [40];
  SerializedData *pSVar4;
  char (*in_R8) [32];
  string _msg;
  char *Name_local;
  
  Args_1 = (char (*) [40])0x0;
  Name_local = Name;
  NamedResourceKey::NamedResourceKey((NamedResourceKey *)&_msg,Type,Name,false);
  cVar3 = std::
          _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,(key_type *)&_msg);
  HashMapStringKey::Clear((HashMapStringKey *)&_msg._M_string_length);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
      ._M_cur == (__node_type *)0x0) {
    FormatString<char[11],char_const*,char[32]>
              (&_msg,(Diligent *)"Resource \'",(char (*) [11])&Name_local,
               (char **)"\' is not present in the archive",in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&_msg);
    pSVar4 = &GetDeviceSpecificData::NullData;
    if (GetDeviceSpecificData(Diligent::DeviceObjectArchive::ResourceType,char_const*,Diligent::DeviceObjectArchive::DeviceType)
        ::NullData == '\0') {
      iVar2 = __cxa_guard_acquire(&GetDeviceSpecificData(Diligent::DeviceObjectArchive::ResourceType,char_const*,Diligent::DeviceObjectArchive::DeviceType)
                                   ::NullData);
      if (iVar2 != 0) {
        GetDeviceSpecificData::NullData.m_Size = 0;
        GetDeviceSpecificData::NullData.m_Hash.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)0;
        GetDeviceSpecificData::NullData.m_pAllocator = (IMemoryAllocator *)0x0;
        GetDeviceSpecificData::NullData.m_Ptr = (void *)0x0;
        pSVar4 = &GetDeviceSpecificData::NullData;
        __cxa_atexit(SerializedData::~SerializedData,&GetDeviceSpecificData::NullData,&__dso_handle)
        ;
        __cxa_guard_release(&GetDeviceSpecificData(Diligent::DeviceObjectArchive::ResourceType,char_const*,Diligent::DeviceObjectArchive::DeviceType)
                             ::NullData);
      }
    }
  }
  else {
    bVar1 = SafeStrEqual(Name,*(char **)((long)cVar3.
                                               super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                               ._M_cur + 0x10));
    if (!bVar1) {
      FormatString<char[26],char[40]>
                (&_msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SafeStrEqual(Name, it->first.GetName())",Args_1);
      DebugAssertionFailed
                (_msg._M_dataplus._M_p,"GetDeviceSpecificData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                 ,0x16a);
      std::__cxx11::string::~string((string *)&_msg);
    }
    pSVar4 = (SerializedData *)
             ((long)cVar3.
                    super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                    ._M_cur + (ulong)DevType * 0x20 + 0x40);
  }
  return pSVar4;
}

Assistant:

const SerializedData& DeviceObjectArchive::GetDeviceSpecificData(ResourceType Type,
                                                                 const char*  Name,
                                                                 DeviceType   DevType) const noexcept
{
    auto it = m_NamedResources.find(NamedResourceKey{Type, Name});
    if (it == m_NamedResources.end())
    {
        LOG_ERROR_MESSAGE("Resource '", Name, "' is not present in the archive");
        static const SerializedData NullData;
        return NullData;
    }
    VERIFY_EXPR(SafeStrEqual(Name, it->first.GetName()));
    return it->second.DeviceSpecific[static_cast<size_t>(DevType)];
}